

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogWriter.h
# Opt level: O2

void __thiscall LogWriter::finish(LogWriter *this)

{
  ofstream *poVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  
  poVar1 = &this->logfile_;
  poVar2 = std::operator<<((ostream *)poVar1,">--");
  this->iteration_ = this->iteration_ + 1;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,"--<");
  std::endl<char,std::char_traits<char>>(poVar2);
  for (p_Var3 = (this->vertices_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->vertices_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar2," ->");
    p_Var4 = (_Base_ptr)&p_Var3[1]._M_parent;
    while (p_Var4 = *(_Base_ptr *)p_Var4, p_Var4 != (_Base_ptr)&p_Var3[1]._M_parent) {
      poVar2 = std::operator<<((ostream *)poVar1," ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    }
    std::endl<char,std::char_traits<char>>((ostream *)poVar1);
  }
  poVar2 = std::operator<<((ostream *)poVar1,"---");
  std::endl<char,std::char_traits<char>>(poVar2);
  for (p_Var3 = (this->cliques_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->cliques_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar2,":");
    p_Var4 = (_Base_ptr)&p_Var3[1]._M_parent;
    while (p_Var4 = *(_Base_ptr *)p_Var4, p_Var4 != (_Base_ptr)&p_Var3[1]._M_parent) {
      poVar2 = std::operator<<((ostream *)poVar1," ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    }
    std::endl<char,std::char_traits<char>>((ostream *)poVar1);
  }
  return;
}

Assistant:

void finish() {
        logfile_ << ">--" << iteration_++ << "--<" << std::endl;

        for (const auto& adj : vertices_) {
            logfile_ << adj.first << " ->";
            for (const auto& i : adj.second) {
                logfile_ << " " << i;
            }
            logfile_ << std::endl;
        }

        logfile_ << "---" << std::endl;

        for (const auto& cl : cliques_) {
            logfile_ << cl.first << ":";
            for (const auto& i : cl.second) {
                logfile_ << " " << i;
            }
            logfile_ << std::endl;
        }

    }